

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_dump_image_comp_header
               (opj_image_comp_t *comp_header,OPJ_BOOL dev_dump_flag,FILE *out_stream)

{
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  FILE *pFStack_20;
  char tab [3];
  FILE *out_stream_local;
  OPJ_BOOL dev_dump_flag_local;
  opj_image_comp_t *comp_header_local;
  
  pFStack_20 = (FILE *)out_stream;
  if (dev_dump_flag == 0) {
    local_23 = 9;
    local_22 = 9;
    local_21 = 0;
  }
  else {
    fprintf(_stdout,"[DEV] Dump an image_comp_header struct {\n");
    local_23 = 0;
  }
  fprintf(pFStack_20,"%s dx=%d, dy=%d\n",&local_23,(ulong)comp_header->dx,(ulong)comp_header->dy);
  fprintf(pFStack_20,"%s prec=%d\n",&local_23,(ulong)comp_header->prec);
  fprintf(pFStack_20,"%s sgnd=%d\n",&local_23,(ulong)comp_header->sgnd);
  if (dev_dump_flag != 0) {
    fprintf(pFStack_20,"}\n");
  }
  return;
}

Assistant:

void j2k_dump_image_comp_header(opj_image_comp_t* comp_header,
                                OPJ_BOOL dev_dump_flag, FILE* out_stream)
{
    char tab[3];

    if (dev_dump_flag) {
        fprintf(stdout, "[DEV] Dump an image_comp_header struct {\n");
        tab[0] = '\0';
    }       else {
        tab[0] = '\t';
        tab[1] = '\t';
        tab[2] = '\0';
    }

    fprintf(out_stream, "%s dx=%d, dy=%d\n", tab, comp_header->dx, comp_header->dy);
    fprintf(out_stream, "%s prec=%d\n", tab, comp_header->prec);
    fprintf(out_stream, "%s sgnd=%d\n", tab, comp_header->sgnd);

    if (dev_dump_flag) {
        fprintf(out_stream, "}\n");
    }
}